

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O2

pageant_pubkey * find_key(char *string,char **retstr)

{
  _Bool _Var1;
  int iVar2;
  int iVar3;
  uint type;
  Filename *filename;
  pageant_pubkey *ppVar4;
  long lVar5;
  char *pcVar6;
  byte bVar7;
  uint i;
  long lVar8;
  _Bool _Var9;
  key_find_ctx ctx [1];
  pageant_pubkey key_in;
  
  iVar2 = strncmp(string,"file:",5);
  if (iVar2 != 0) {
    iVar3 = strncmp(string,"comment:",8);
    if (iVar3 == 0) {
      string = string + 8;
      bVar7 = 1;
      lVar5 = 1;
      ctx[0].match_fp = false;
      ctx[0].match_comment = true;
      goto LAB_00109fb4;
    }
    if (((*string == 'f') && (string[1] == 'p')) && (string[2] == ':')) {
      string = string + 3;
    }
    else {
      iVar3 = strncmp(string,"fingerprint:",0xc);
      if (iVar3 != 0) {
        iVar3 = strncasecmp(string,"md5:",4);
        if (iVar3 == 0) {
          string = string + 4;
          lVar5 = 0;
        }
        else {
          iVar3 = strncmp(string,"sha256:",7);
          _Var9 = true;
          if (iVar3 != 0) goto LAB_00109e27;
          string = string + 7;
          lVar5 = 1;
        }
        bVar7 = 0;
        ctx[0].match_fp = true;
        ctx[0].match_comment = false;
        goto LAB_00109fb4;
      }
      string = string + 0xc;
    }
    bVar7 = 1;
    lVar5 = 1;
    ctx[0].match_fp = true;
    ctx[0].match_comment = false;
    goto LAB_00109fb4;
  }
  string = string + 5;
  _Var9 = false;
LAB_00109e27:
  filename = filename_from_str(string);
  type = key_type(filename);
  if (type < 0xb) {
    if ((0x608U >> (type & 0x1f) & 1) == 0) {
      if ((0x104U >> (type & 0x1f) & 1) == 0) goto LAB_00109f9c;
      key_in.blob = strbuf_new();
      iVar3 = rsa1_loadpub_f(filename,(key_in.blob)->binarysink_,(char **)0x0,&ctx[0].string);
      if (iVar3 == 0) goto LAB_00109f53;
      key_in.ssh_version = 1;
    }
    else {
      key_in.blob = strbuf_new();
      _Var1 = ppk_loadpub_f(filename,(char **)0x0,(key_in.blob)->binarysink_,(char **)0x0,
                            &ctx[0].string);
      if (!_Var1) {
LAB_00109f53:
        strbuf_free(key_in.blob);
        key_in.blob = (strbuf *)0x0;
        if (iVar2 != 0) goto LAB_00109fa4;
        pcVar6 = "unable to load file \'%s\': %s";
        goto LAB_0010a08a;
      }
      key_in.ssh_version = 2;
    }
    key_in.comment = (char *)0x0;
    ppVar4 = pageant_pubkey_copy(&key_in);
    strbuf_free(key_in.blob);
    key_in.blob = (strbuf *)0x0;
  }
  else {
LAB_00109f9c:
    if (iVar2 != 0) {
LAB_00109fa4:
      filename_free(filename);
      bVar7 = 1;
      lVar5 = 1;
      ctx[0].match_fp = _Var9;
      ctx[0].match_comment = _Var9;
LAB_00109fb4:
      for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
        ctx[0].match_fptypes[lVar8] = (_Bool)(lVar5 == lVar8 | bVar7);
      }
      ctx[0].found = (pageant_pubkey *)0x0;
      ctx[0].nfound = 0;
      ctx[0].string = string;
      iVar2 = pageant_enum_keys(key_find_callback,ctx,retstr);
      if (iVar2 != 1) {
        if (ctx[0].nfound == 0) {
          pcVar6 = dupstr("no key matched");
          *retstr = pcVar6;
          if (ctx[0].found != (pageant_pubkey *)0x0) {
            __assert_fail("!ctx->found",
                          "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/pageant.c"
                          ,0x32b,"struct pageant_pubkey *find_key(const char *, char **)");
          }
        }
        else {
          if (ctx[0].nfound < 2) {
            if (ctx[0].found != (pageant_pubkey *)0x0) {
              return ctx[0].found;
            }
            __assert_fail("ctx->found",
                          "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/pageant.c"
                          ,0x334,"struct pageant_pubkey *find_key(const char *, char **)");
          }
          pcVar6 = dupstr("multiple keys matched");
          *retstr = pcVar6;
          if (ctx[0].found == (pageant_pubkey *)0x0) {
            __assert_fail("ctx->found",
                          "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/pageant.c"
                          ,0x32f,"struct pageant_pubkey *find_key(const char *, char **)");
          }
          pageant_pubkey_free(ctx[0].found);
        }
      }
      return (pageant_pubkey *)0x0;
    }
    ctx[0].string = key_type_to_str(type);
    pcVar6 = "unable to load key file \'%s\': %s";
LAB_0010a08a:
    ppVar4 = (pageant_pubkey *)0x0;
    pcVar6 = dupprintf(pcVar6,string,ctx[0].string);
    *retstr = pcVar6;
  }
  filename_free(filename);
  return ppVar4;
}

Assistant:

struct pageant_pubkey *find_key(const char *string, char **retstr)
{
    struct key_find_ctx ctx[1];
    struct pageant_pubkey key_in, *key_ret;
    bool try_file = true, try_fp = true, try_comment = true;
    bool file_errors = false;
    bool try_all_fptypes = true;
    FingerprintType fptype = SSH_FPTYPE_DEFAULT;

    /*
     * Trim off disambiguating prefixes telling us how to interpret
     * the provided string.
     */
    if (!strncmp(string, "file:", 5)) {
        string += 5;
        try_fp = false;
        try_comment = false;
        file_errors = true; /* also report failure to load the file */
    } else if (!strncmp(string, "comment:", 8)) {
        string += 8;
        try_file = false;
        try_fp = false;
    } else if (!strncmp(string, "fp:", 3)) {
        string += 3;
        try_file = false;
        try_comment = false;
    } else if (!strncmp(string, "fingerprint:", 12)) {
        string += 12;
        try_file = false;
        try_comment = false;
    } else if (!strnicmp(string, "md5:", 4)) {
        string += 4;
        try_file = false;
        try_comment = false;
        try_all_fptypes = false;
        fptype = SSH_FPTYPE_MD5;
    } else if (!strncmp(string, "sha256:", 7)) {
        string += 7;
        try_file = false;
        try_comment = false;
        try_all_fptypes = false;
        fptype = SSH_FPTYPE_SHA256;
    }

    /*
     * Try interpreting the string as a key file name.
     */
    if (try_file) {
        Filename *fn = filename_from_str(string);
        int keytype = key_type(fn);
        if (keytype == SSH_KEYTYPE_SSH1 ||
            keytype == SSH_KEYTYPE_SSH1_PUBLIC) {
            const char *error;

            key_in.blob = strbuf_new();
            if (!rsa1_loadpub_f(fn, BinarySink_UPCAST(key_in.blob),
                                NULL, &error)) {
                strbuf_free(key_in.blob);
                key_in.blob = NULL;
                if (file_errors) {
                    *retstr = dupprintf("unable to load file '%s': %s",
                                        string, error);
                    filename_free(fn);
                    return NULL;
                }
            } else {
                /*
                 * If we've successfully loaded the file, stop here - we
                 * already have a key blob and need not go to the agent to
                 * list things.
                 */
                key_in.ssh_version = 1;
                key_in.comment = NULL;
                key_ret = pageant_pubkey_copy(&key_in);
                strbuf_free(key_in.blob);
                key_in.blob = NULL;
                filename_free(fn);
                return key_ret;
            }
        } else if (keytype == SSH_KEYTYPE_SSH2 ||
                   keytype == SSH_KEYTYPE_SSH2_PUBLIC_RFC4716 ||
                   keytype == SSH_KEYTYPE_SSH2_PUBLIC_OPENSSH) {
            const char *error;

            key_in.blob = strbuf_new();
            if (!ppk_loadpub_f(fn, NULL, BinarySink_UPCAST(key_in.blob),
                               NULL, &error)) {
                strbuf_free(key_in.blob);
                key_in.blob = NULL;
                if (file_errors) {
                    *retstr = dupprintf("unable to load file '%s': %s",
                                        string, error);
                    filename_free(fn);
                    return NULL;
                }
            } else {
                /*
                 * If we've successfully loaded the file, stop here - we
                 * already have a key blob and need not go to the agent to
                 * list things.
                 */
                key_in.ssh_version = 2;
                key_in.comment = NULL;
                key_ret = pageant_pubkey_copy(&key_in);
                strbuf_free(key_in.blob);
                key_in.blob = NULL;
                filename_free(fn);
                return key_ret;
            }
        } else {
            if (file_errors) {
                *retstr = dupprintf("unable to load key file '%s': %s",
                                    string, key_type_to_str(keytype));
                filename_free(fn);
                return NULL;
            }
        }
        filename_free(fn);
    }

    /*
     * Failing that, go through the keys in the agent, and match
     * against fingerprints and comments as appropriate.
     */
    ctx->string = string;
    ctx->match_fp = try_fp;
    ctx->match_comment = try_comment;
    for (unsigned i = 0; i < SSH_N_FPTYPES; i++)
        ctx->match_fptypes[i] = (try_all_fptypes || i == fptype);
    ctx->found = NULL;
    ctx->nfound = 0;
    if (pageant_enum_keys(key_find_callback, ctx, retstr) ==
        PAGEANT_ACTION_FAILURE)
        return NULL;

    if (ctx->nfound == 0) {
        *retstr = dupstr("no key matched");
        assert(!ctx->found);
        return NULL;
    } else if (ctx->nfound > 1) {
        *retstr = dupstr("multiple keys matched");
        assert(ctx->found);
        pageant_pubkey_free(ctx->found);
        return NULL;
    }

    assert(ctx->found);
    return ctx->found;
}